

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O0

int Acec_InsertBox_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iLit1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0x7a,"int Acec_InsertBox_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    Acec_InsertBox_rec(pNew,p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    Acec_InsertBox_rec(pNew,p,pGVar2);
    iVar1 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    pNew_local._4_4_ = Gia_ManAppendAnd2(pNew,iVar1,iLit1);
    pObj->Value = pNew_local._4_4_;
  }
  else {
    pNew_local._4_4_ = pObj->Value;
  }
  return pNew_local._4_4_;
}

Assistant:

int Acec_InsertBox_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Acec_InsertBox_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Acec_InsertBox_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return (pObj->Value = Gia_ManAppendAnd2( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) ));
}